

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int btrunc(bstring b,int n)

{
  int n_local;
  bstring b_local;
  
  if ((((n < 0) || (b == (bstring)0x0)) || (b->data == (uchar *)0x0)) ||
     (((b->mlen < b->slen || (b->slen < 0)) || (b->mlen < 1)))) {
    b_local._4_4_ = -1;
  }
  else {
    if (n < b->slen) {
      b->slen = n;
      b->data[n] = '\0';
    }
    b_local._4_4_ = 0;
  }
  return b_local._4_4_;
}

Assistant:

int btrunc (bstring b, int n) {
	if (n < 0 || b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;
	if (b->slen > n) {
		b->slen = n;
		b->data[n] = (unsigned char) '\0';
	}
	return BSTR_OK;
}